

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetResourceDimString(RESOURCE_DIMENSION TexType)

{
  char *pcVar1;
  string msg;
  string local_30;
  
  if (GetResourceDimString(Diligent::RESOURCE_DIMENSION)::TexTypeStrings == '\0') {
    GetResourceDimString();
  }
  if (TexType < RESOURCE_DIM_NUM_DIMENSIONS) {
    pcVar1 = GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[TexType];
  }
  else {
    pcVar1 = "Unknown texture type";
    FormatString<char[21]>(&local_30,(char (*) [21])"Unknown texture type");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar1;
}

Assistant:

const Char* GetResourceDimString(RESOURCE_DIMENSION TexType)
{
    struct ResourceDimToStringMap
    {
        ResourceDimToStringMap()
        {
            TexTypeStrings[RESOURCE_DIM_UNDEFINED]      = "Undefined";
            TexTypeStrings[RESOURCE_DIM_BUFFER]         = "Buffer";
            TexTypeStrings[RESOURCE_DIM_TEX_1D]         = "Texture 1D";
            TexTypeStrings[RESOURCE_DIM_TEX_1D_ARRAY]   = "Texture 1D Array";
            TexTypeStrings[RESOURCE_DIM_TEX_2D]         = "Texture 2D";
            TexTypeStrings[RESOURCE_DIM_TEX_2D_ARRAY]   = "Texture 2D Array";
            TexTypeStrings[RESOURCE_DIM_TEX_3D]         = "Texture 3D";
            TexTypeStrings[RESOURCE_DIM_TEX_CUBE]       = "Texture Cube";
            TexTypeStrings[RESOURCE_DIM_TEX_CUBE_ARRAY] = "Texture Cube Array";
            static_assert(RESOURCE_DIM_NUM_DIMENSIONS == 9, "Not all texture type strings initialized.");
        }

        const Char* operator[](RESOURCE_DIMENSION TexType) const
        {
            if (TexType >= RESOURCE_DIM_UNDEFINED && TexType < RESOURCE_DIM_NUM_DIMENSIONS)
                return TexTypeStrings[TexType];
            else
            {
                UNEXPECTED("Unknown texture type");
                return "Unknown texture type";
            }
        }

    private:
        std::array<const Char*, RESOURCE_DIM_NUM_DIMENSIONS> TexTypeStrings{};
    };

    static const ResourceDimToStringMap TexTypeStrings;
    return TexTypeStrings[TexType];
}